

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QList<QByteArrayView> * __thiscall
QTimeZonePrivate::matchingTimeZoneIds(QTimeZonePrivate *this,Territory territory)

{
  bool bVar1;
  QLatin1String *pQVar2;
  QByteArrayView *this_00;
  short in_DX;
  QList<QByteArrayView> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  TokenizerResult<const_QLatin1String_&,_char16_t> *__range4;
  ZoneData *data_1;
  ZoneData *__end2_1;
  ZoneData *__begin2_1;
  ZoneData (*__range2_1) [361];
  WindowsData *data;
  WindowsData *__end2;
  WindowsData *__begin2;
  WindowsData (*__range2) [139];
  QList<QByteArrayView> *regions;
  QLatin1String l1;
  sentinel __end4;
  iterator __begin4;
  rvalue_ref in_stack_fffffffffffffea8;
  iterator *in_stack_fffffffffffffeb0;
  undefined2 *local_f0;
  undefined2 *local_c0;
  QLatin1String local_88;
  undefined1 local_71;
  undefined1 local_70 [56];
  QByteArrayView local_38;
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArrayView>::QList((QList<QByteArrayView> *)0x739f11);
  if (in_DX == 0x102) {
    for (local_c0 = &QtTimeZoneCldr::windowsDataTable; local_c0 != (undefined2 *)&DAT_00a05f04;
        local_c0 = local_c0 + 6) {
      QVar3 = QtTimeZoneCldr::WindowsData::ianaId((WindowsData *)in_stack_fffffffffffffeb0);
      local_38 = QVar3;
      QList<QByteArrayView>::operator<<
                ((QList<QByteArrayView> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
  }
  else {
    for (local_f0 = &QtTimeZoneCldr::zoneDataTable; local_f0 != (undefined2 *)&DAT_00a05816;
        local_f0 = local_f0 + 3) {
      if (local_f0[1] == in_DX) {
        QtTimeZoneCldr::ZoneData::ids((ZoneData *)in_stack_fffffffffffffeb0);
        memset(local_70,0xaa,0x38);
        QStringTokenizerBase<QLatin1String,_QChar>::begin
                  ((QStringTokenizerBase<QLatin1String,_QChar> *)in_stack_fffffffffffffeb0);
        local_71 = 0xaa;
        QStringTokenizerBase<QLatin1String,_QChar>::end(&local_28);
        while (bVar1 = ::operator!=(local_70), bVar1) {
          local_88.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_88.m_data = &DAT_aaaaaaaaaaaaaaaa;
          pQVar2 = QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*
                             ((iterator *)0x73a128);
          local_88.m_size = pQVar2->m_size;
          local_88.m_data = pQVar2->m_data;
          pQVar2 = &local_88;
          this_00 = (QByteArrayView *)QLatin1String::data(pQVar2);
          QLatin1String::size(pQVar2);
          QByteArrayView::QByteArrayView<char,_true>
                    (this_00,(char *)pQVar2,(qsizetype)in_stack_fffffffffffffeb0);
          QList<QByteArrayView>::operator<<
                    ((QList<QByteArrayView> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator++
                    (in_stack_fffffffffffffeb0);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArrayView> QTimeZonePrivate::matchingTimeZoneIds(QLocale::Territory territory) const
{
    // Default fall-back mode: use the CLDR data to find zones for this territory.
    QList<QByteArrayView> regions;
#if QT_CONFIG(timezone_locale) && !QT_CONFIG(icu)
    regions = QtTimeZoneLocale::ianaIdsForTerritory(territory);
#endif
    // Get all Zones in the table associated with this territory:
    if (territory == QLocale::World) {
        // World names are filtered out of zoneDataTable to provide the defaults
        // in windowsDataTable.
        for (const WindowsData &data : windowsDataTable)
            regions << data.ianaId();
    } else {
        for (const ZoneData &data : zoneDataTable) {
            if (data.territory == territory) {
                for (auto l1 : data.ids())
                    regions << QByteArrayView(l1.data(), l1.size());
            }
        }
    }
    return regions;
}